

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall google::protobuf::internal::UntypedMapIterator::PlusPlus(UntypedMapIterator *this)

{
  NodeBase *pNVar1;
  uint uVar2;
  
  pNVar1 = this->node_->next;
  if (pNVar1 != (NodeBase *)0x0) {
    this->node_ = pNVar1;
    return;
  }
  uVar2 = this->bucket_index_;
  do {
    uVar2 = uVar2 + 1;
    if (this->m_->num_buckets_ <= uVar2) {
      this->node_ = (NodeBase *)0x0;
      this->bucket_index_ = 0;
      return;
    }
    pNVar1 = this->m_->table_[uVar2];
  } while (pNVar1 == (NodeBase *)0x0);
  this->node_ = pNVar1;
  this->bucket_index_ = uVar2;
  return;
}

Assistant:

inline void UntypedMapIterator::PlusPlus() {
  if (node_->next != nullptr) {
    node_ = node_->next;
    return;
  }

  for (map_index_t i = bucket_index_ + 1; i < m_->num_buckets_; ++i) {
    NodeBase* node = m_->table_[i];
    if (node == nullptr) continue;
    node_ = node;
    bucket_index_ = i;
    return;
  }

  node_ = nullptr;
  bucket_index_ = 0;
}